

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

ErrorOr<llvm::sys::fs::perms> *
llvm::sys::fs::getPermissions(ErrorOr<llvm::sys::fs::perms> *__return_storage_ptr__,Twine *Path)

{
  bool bVar1;
  error_code eVar2;
  perms local_84;
  undefined8 local_80;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  error_code EC;
  file_status Status;
  Twine *Path_local;
  
  file_status::file_status((file_status *)&EC._M_cat);
  eVar2 = status(Path,(file_status *)&EC._M_cat,true);
  EC._0_8_ = eVar2._M_cat;
  local_78._8_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)(local_78 + 8));
  if (bVar1) {
    local_80 = CONCAT44(uStack_6c,local_78._8_4_);
    local_78._0_8_ = EC._0_8_;
    eVar2._4_4_ = 0;
    eVar2._M_value = local_78._8_4_;
    eVar2._M_cat = (error_category *)EC._0_8_;
    ErrorOr<llvm::sys::fs::perms>::ErrorOr(__return_storage_ptr__,eVar2);
  }
  else {
    local_84 = basic_file_status::permissions((basic_file_status *)&EC._M_cat);
    ErrorOr<llvm::sys::fs::perms>::ErrorOr<llvm::sys::fs::perms>
              (__return_storage_ptr__,&local_84,(type *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<perms> getPermissions(const Twine &Path) {
  file_status Status;
  if (std::error_code EC = status(Path, Status))
    return EC;

  return Status.permissions();
}